

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDFObjectHandle::newArray(QPDFObjectHandle *this,QPDFMatrix *matrix)

{
  initializer_list<QPDFObjectHandle> __l;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar1;
  QPDFObjectHandle *local_d8;
  allocator<QPDFObjectHandle> local_b5 [13];
  QPDFObjectHandle *local_a8;
  undefined1 local_a0 [32];
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_30;
  QPDFMatrix *local_18;
  QPDFMatrix *matrix_local;
  
  local_a8 = (QPDFObjectHandle *)local_a0;
  local_18 = matrix;
  matrix_local = (QPDFMatrix *)this;
  newReal(local_a8,matrix->a,0,true);
  local_a8 = (QPDFObjectHandle *)(local_a0 + 0x10);
  newReal(local_a8,local_18->b,0,true);
  local_a8 = &local_80;
  newReal(local_a8,local_18->c,0,true);
  local_a8 = &local_70;
  newReal(local_a8,local_18->d,0,true);
  local_a8 = &local_60;
  newReal(local_a8,local_18->e,0,true);
  local_a8 = &local_50;
  newReal(local_a8,local_18->f,0,true);
  local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a0;
  local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
  std::allocator<QPDFObjectHandle>::allocator(local_b5);
  __l._M_len = (size_type)
               local_40.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_40.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&local_30,__l,local_b5);
  newArray(this,&local_30);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_30);
  std::allocator<QPDFObjectHandle>::~allocator(local_b5);
  local_d8 = &local_40;
  do {
    local_d8 = local_d8 + -1;
    ~QPDFObjectHandle(local_d8);
  } while (local_d8 != (QPDFObjectHandle *)local_a0);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::newArray(QPDFMatrix const& matrix)
{
    return newArray(
        {newReal(matrix.a),
         newReal(matrix.b),
         newReal(matrix.c),
         newReal(matrix.d),
         newReal(matrix.e),
         newReal(matrix.f)});
}